

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_70::crashHandler(anon_unknown_70 *this,int signo,siginfo_t *info,void *context)

{
  ArrayPtr<void_*const> trace;
  char *__n;
  void *__buf;
  ArrayPtr<void_*> space;
  ArrayPtr<void_*const> AVar1;
  ArrayPtr<void_*const> trace_00;
  char *pcVar2;
  size_t in_stack_fffffffffffffe78;
  undefined1 local_17d;
  int signo_local;
  Array<char> local_178;
  char *local_160;
  String message;
  Array<char> local_140;
  void *traceSpace [32];
  
  signo_local = (int)this;
  memset((kj *)traceSpace,0,0x100);
  space.size_ = 2;
  space.ptr = (void **)0x20;
  AVar1 = getStackTrace((kj *)traceSpace,space,(uint)context);
  trace_00.ptr = (void **)AVar1.size_;
  local_160 = strsignal((int)this);
  trace.size_ = in_stack_fffffffffffffe78;
  trace.ptr = (void **)0x193918;
  stringifyStackTraceAddresses(trace);
  pcVar2 = (char *)0x19392b;
  trace_00.size_ = (size_t)context;
  stringifyStackTrace((String *)&local_140,(kj *)AVar1.ptr,trace_00);
  local_17d = 10;
  __n = ": ";
  str<char_const(&)[22],int&,char_const(&)[3],char*,char_const(&)[9],kj::String,kj::String,char>
            (&message,(kj *)"*** Received signal #",(char (*) [22])&signo_local,(int *)0x1c1f42,
             (char (*) [3])&local_160,(char **)0x1ce8a2,(char (*) [9])&local_178,
             (String *)&local_140,(String *)&local_17d,pcVar2);
  Array<char>::~Array(&local_140);
  Array<char>::~Array(&local_178);
  local_178.ptr = (char *)&PTR__FdOutputStream_0021e730;
  local_178.size_ = 0xffffffff00000002;
  pcVar2 = (char *)message.content.size_;
  if (message.content.size_ != 0) {
    pcVar2 = message.content.ptr;
  }
  __buf = (void *)0x0;
  if (message.content.size_ != 0) {
    __buf = (void *)(message.content.size_ - 1);
  }
  FdOutputStream::write((FdOutputStream *)&local_178,(int)pcVar2,__buf,(size_t)__n);
  FdOutputStream::~FdOutputStream((FdOutputStream *)&local_178);
  _exit(1);
}

Assistant:

[[noreturn]] void crashHandler(int signo, siginfo_t* info, void* context) {
  void* traceSpace[32]{};

#if KJ_USE_WIN32_DBGHELP
  // Win32 backtracing can't trace its way out of a Cygwin signal handler. However, Cygwin gives
  // us direct access to the CONTEXT, which we can pass to the Win32 tracing functions.
  ucontext_t* ucontext = reinterpret_cast<ucontext_t*>(context);
  // Cygwin's mcontext_t has the same layout as CONTEXT.
  // TODO(someday): Figure out why this produces garbage for SIGINT from ctrl+C. It seems to work
  //   correctly for SIGSEGV.
  CONTEXT win32Context;
  static_assert(sizeof(ucontext->uc_mcontext) >= sizeof(win32Context),
      "mcontext_t should be an extension of CONTEXT");
  memcpy(&win32Context, &ucontext->uc_mcontext, sizeof(win32Context));
  auto trace = getStackTrace(traceSpace, 0, GetCurrentThread(), win32Context);
#else
  // ignoreCount = 2 to ignore crashHandler() and signal trampoline.
  auto trace = getStackTrace(traceSpace, 2);
#endif

  auto message = kj::str("*** Received signal #", signo, ": ", strsignal(signo),
                         "\nstack: ", stringifyStackTraceAddresses(trace),
                         stringifyStackTrace(trace), '\n');

  FdOutputStream(STDERR_FILENO).write(message.asBytes());
  _exit(1);
}